

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O1

size_t HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,uint singleStream,void *workSpace,size_t wkspSize,HUF_CElt *oldHufTable,
                 HUF_repeat *repeat,int preferRepeat,int bmi2)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  BYTE *pBVar10;
  uint maxSymbolValue_local;
  HUF_CElt *local_48;
  size_t local_40;
  BYTE *local_38;
  
  if (((ulong)workSpace & 3) != 0) {
    return 0xffffffffffffffff;
  }
  if (wkspSize < 0x1800) {
    return 0xffffffffffffffbe;
  }
  if (dstSize == 0 || srcSize == 0) {
    return 0;
  }
  if (0x20000 < srcSize) {
    return 0xffffffffffffffb8;
  }
  if (0xc < huffLog) {
    return 0xffffffffffffffd4;
  }
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  maxSymbolValue_local = maxSymbolValue;
  if (maxSymbolValue == 0) {
    maxSymbolValue_local = 0xff;
  }
  local_38 = (BYTE *)((long)dst + dstSize);
  uVar4 = 0xb;
  if (huffLog != 0) {
    uVar4 = huffLog;
  }
  if ((repeat != (HUF_repeat *)0x0 && preferRepeat != 0) && (*repeat == HUF_repeat_valid)) {
    sVar5 = HUF_compressCTable_internal
                      ((BYTE *)dst,(BYTE *)dst,local_38,src,srcSize,singleStream,oldHufTable,bmi2);
    return sVar5;
  }
  local_48 = (HUF_CElt *)CONCAT71(local_48._1_7_,repeat != (HUF_repeat *)0x0 && preferRepeat != 0);
  local_40 = CONCAT44(local_40._4_4_,uVar4);
  sVar5 = FSE_count_wksp((uint *)workSpace,&maxSymbolValue_local,src,srcSize,(uint *)workSpace);
  if (sVar5 < 0xffffffffffffff89) {
    if (sVar5 == srcSize) {
      *(undefined1 *)dst = *src;
      sVar5 = 1;
      bVar2 = false;
    }
    else {
      bVar2 = false;
      uVar4 = 0;
      if ((srcSize >> 7) + 1 < sVar5) {
        if ((ulong)maxSymbolValue_local == 0) {
          lVar8 = 0;
          uVar7 = 0;
        }
        else {
          uVar9 = 0;
          uVar7 = 0;
          lVar8 = 0;
          uVar4 = 0;
          do {
            uVar1 = *(uint *)((long)workSpace + uVar9 * 4);
            if ((ulong)uVar1 != 0) {
              uVar7 = uVar7 + uVar1;
              uVar4 = uVar4 + 1;
              uVar3 = 0x1f;
              if (uVar1 != 0) {
                for (; uVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
                }
              }
              lVar8 = lVar8 + (ulong)(((uVar3 ^ 0xffffffe0) + 0x21) * uVar1);
            }
            uVar9 = uVar9 + 1;
          } while (maxSymbolValue_local != uVar9);
        }
        bVar2 = uVar7 >> 0x20 != 0;
        uVar1 = (uint)(uVar7 >> 0x20);
        if (!bVar2) {
          uVar1 = (uint)uVar7;
        }
        uVar3 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        bVar2 = (uVar4 >> (2U - (uVar4 < 0x41) & 0x1f)) +
                (int)((((uint)bVar2 * 0x20 - (uVar3 ^ 0x1f)) + 0x20) * uVar7 - lVar8 >> 3) <=
                srcSize;
      }
      sVar5 = 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (!bVar2) {
    return sVar5;
  }
  if (((repeat != (HUF_repeat *)0x0) && (*repeat == HUF_repeat_check)) &&
     (-1 < (int)maxSymbolValue_local)) {
    lVar8 = 0;
    bVar2 = false;
    do {
      bVar2 = (bool)(bVar2 | (oldHufTable[lVar8].nbBits == '\0' &&
                             *(int *)((long)workSpace + lVar8 * 4) != 0));
      lVar8 = lVar8 + 1;
    } while ((ulong)maxSymbolValue_local + 1 != lVar8);
    if (bVar2) {
      *repeat = HUF_repeat_none;
    }
  }
  pBVar10 = (BYTE *)dst;
  if (((char)local_48 != '\0') && (*repeat != HUF_repeat_none)) goto LAB_0018886d;
  uVar4 = FSE_optimalTableLog_internal((U32)local_40,srcSize,maxSymbolValue_local,1);
  local_48 = (HUF_CElt *)((long)workSpace + 0x400);
  local_40 = CONCAT44(local_40._4_4_,uVar4);
  sVar6 = HUF_buildCTable_wksp
                    (local_48,(U32 *)workSpace,maxSymbolValue_local,uVar4,
                     (void *)((long)workSpace + 0x800),0x1000);
  if (sVar6 < 0xffffffffffffff89) {
    local_40 = sVar6;
    memset(local_48 + (maxSymbolValue_local + 1),0,(ulong)(maxSymbolValue_local + 1) * -4 + 0x400);
    sVar6 = local_40;
  }
  else {
    sVar5 = sVar6;
  }
  if (0xffffffffffffff88 < sVar6) {
    return sVar5;
  }
  sVar6 = HUF_writeCTable(dst,dstSize,local_48,maxSymbolValue_local,(U32)local_40);
  if (sVar6 < 0xffffffffffffff89) {
    if ((repeat != (HUF_repeat *)0x0) && (*repeat != HUF_repeat_none)) {
      if ((int)maxSymbolValue_local < 0) {
        uVar7 = 0;
      }
      else {
        lVar8 = 0;
        uVar7 = 0;
        do {
          uVar7 = uVar7 + (uint)oldHufTable[lVar8].nbBits * *(int *)((long)workSpace + lVar8 * 4);
          lVar8 = lVar8 + 1;
        } while ((ulong)maxSymbolValue_local + 1 != lVar8);
        uVar7 = uVar7 >> 3;
      }
      if ((int)maxSymbolValue_local < 0) {
        uVar9 = 0;
      }
      else {
        lVar8 = 0;
        uVar9 = 0;
        do {
          uVar9 = uVar9 + (uint)*(byte *)((long)workSpace + lVar8 * 4 + 0x402) *
                          *(int *)((long)workSpace + lVar8 * 4);
          lVar8 = lVar8 + 1;
        } while ((ulong)maxSymbolValue_local + 1 != lVar8);
        uVar9 = uVar9 >> 3;
      }
      if (srcSize <= sVar6 + 0xc || uVar7 <= uVar9 + sVar6) {
        sVar6 = HUF_compressCTable_internal
                          ((BYTE *)dst,(BYTE *)dst,local_38,src,srcSize,singleStream,oldHufTable,
                           bmi2);
        goto LAB_0018876c;
      }
    }
    if (sVar6 + 0xc < srcSize) {
      if (repeat != (HUF_repeat *)0x0) {
        *repeat = HUF_repeat_none;
      }
      pBVar10 = (BYTE *)(sVar6 + (long)dst);
      bVar2 = true;
      sVar6 = sVar5;
      if (oldHufTable != (HUF_CElt *)0x0) {
        memcpy(oldHufTable,local_48,0x400);
      }
    }
    else {
      bVar2 = false;
      sVar6 = 0;
    }
  }
  else {
LAB_0018876c:
    bVar2 = false;
  }
  oldHufTable = local_48;
  if (!bVar2) {
    return sVar6;
  }
LAB_0018886d:
  sVar5 = HUF_compressCTable_internal
                    ((BYTE *)dst,pBVar10,local_38,src,srcSize,singleStream,oldHufTable,bmi2);
  return sVar5;
}

Assistant:

static size_t HUF_compress_internal (
                void* dst, size_t dstSize,
                const void* src, size_t srcSize,
                unsigned maxSymbolValue, unsigned huffLog,
                unsigned singleStream,
                void* workSpace, size_t wkspSize,
                HUF_CElt* oldHufTable, HUF_repeat* repeat, int preferRepeat,
                const int bmi2)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)workSpace;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    /* checks & inits */
    if (((size_t)workSpace & 3) != 0) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (wkspSize < sizeof(*table)) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if (preferRepeat && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           singleStream, oldHufTable, bmi2);
    }

    /* Scan input and build symbol stats */
    {  CHECK_V_F(largest, FSE_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, table->count) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7) + 1) {
            return 0;   /* heuristic : probably not compressible enough */
        }

        /* Added this more accurate heuristic to handle high entropy data properly -catid */
        U64 total = 0;
        U64 sum_clogc = 0;
        unsigned nonzero_count = 0;
        for (unsigned i = 0; i < maxSymbolValue; ++i) {
            U32 const c_i = table->count[i];
            if (c_i == 0) {
                continue;
            }
            total += c_i;
            ++nonzero_count;
            unsigned const c_bits = BIT_highbit32(c_i) + 1;
            sum_clogc += c_i * c_bits;
        }
        unsigned t_bits = 0;
        U32 t_bits_input = (U32)total;
        if (total >= 0x100000000ULL) {
            t_bits = 32;
            t_bits_input = (U32)(total >> 32);
        }
        t_bits += BIT_highbit32(t_bits_input) + 1;
        unsigned estimate_bytes = (unsigned)((total * t_bits - sum_clogc) / 8);
        if (nonzero_count > 64) {
            estimate_bytes += nonzero_count / 4;
        }
        else {
            estimate_bytes += nonzero_count / 2;
        }
        if (estimate_bytes > srcSize) {
            return 0;   /* heuristic : probably not compressible enough */
        }
    }

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if (preferRepeat && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           singleStream, oldHufTable, bmi2);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue);
    {   CHECK_V_F(maxBits, HUF_buildCTable_wksp(table->CTable, table->count,
                                                maxSymbolValue, huffLog,
                                                table->nodeTable, sizeof(table->nodeTable)) );
        huffLog = (U32)maxBits;
        /* Zero unused symbols in CTable, so we can check it for validity */
        memset(table->CTable + (maxSymbolValue + 1), 0,
               sizeof(table->CTable) - ((maxSymbolValue + 1) * sizeof(HUF_CElt)));
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable (op, dstSize, table->CTable, maxSymbolValue, huffLog) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   singleStream, oldHufTable, bmi2);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       singleStream, table->CTable, bmi2);
}